

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_map_flow(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  long lVar13;
  bool bVar14;
  undefined1 uVar15;
  int iVar16;
  size_t sVar17;
  State *pSVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  csubstr fmt;
  ro_substr chars;
  ro_substr chars_00;
  basic_substring<const_char> bVar24;
  char msg [35];
  bool is_quoted_1;
  csubstr local_208;
  basic_substring<const_char> local_1f8;
  undefined6 local_1e8;
  undefined1 uStack_1e2;
  undefined1 uStack_1e1;
  undefined6 uStack_1e0;
  undefined1 uStack_1da;
  undefined4 uStack_1d9;
  undefined4 uStack_1d5;
  undefined1 uStack_1d1;
  undefined2 uStack_1d0;
  undefined1 uStack_1ce;
  undefined5 uStack_1cd;
  undefined2 uStack_1c8;
  undefined1 uStack_1c6;
  undefined7 uStack_1c5;
  undefined1 uStack_1be;
  bool local_1b8 [24];
  char *pcStack_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  char *pcStack_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char *pcStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  char *pcStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  local_208 = (this->m_state->line_contents).rem;
  if ((~this->m_state->flags & 0x14U) != 0) {
    local_1e8 = 0x6c6c615f7361;
    uStack_1e2 = 0x28;
    uStack_1e1 = 0x52;
    uStack_1e0 = 0x4c467c50414d;
    uStack_1da = 0x4f;
    local_1f8.str = (char *)0x6166206b63656863;
    local_1f8.len._0_6_ = 0x203a64656c69;
    local_1f8.len._6_1_ = 0x28;
    local_1f8.len._7_1_ = 0x68;
    uStack_1d9 = 0x292957;
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar1 = (code *)swi(3);
      uVar15 = (*pcVar1)();
      return (bool)uVar15;
    }
    local_50 = 0;
    uStack_48 = 0x6f26;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6f26) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x6f26) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1f8,0x23,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  if (local_208.len != 0) {
    if (*local_208.str == ' ') {
      if (((this->m_state->line_contents).rem.len == 0) ||
         (*(this->m_state->line_contents).rem.str != ' ')) {
        uStack_1c8 = 0x775f;
        uStack_1c6 = 0x69;
        uStack_1c5 = 0x292963286874;
        uStack_1d5 = 0x722e7374;
        uStack_1d1 = 0x65;
        uStack_1d0 = 0x2e6d;
        uStack_1ce = 0x62;
        uStack_1cd = 0x736e696765;
        local_1e8 = 0x65746174735f;
        uStack_1e2 = 0x2d;
        uStack_1e1 = 0x3e;
        uStack_1e0 = 0x635f656e696c;
        uStack_1da = 0x6f;
        uStack_1d9 = 0x6e65746e;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_6_ = 0x203a64656c69;
        local_1f8.len._6_1_ = 0x28;
        local_1f8.len._7_1_ = 0x6d;
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar1 = (code *)swi(3);
          uVar15 = (*pcVar1)();
          return (bool)uVar15;
        }
        local_1b8[0] = false;
        local_1b8[1] = false;
        local_1b8[2] = false;
        local_1b8[3] = false;
        local_1b8[4] = false;
        local_1b8[5] = false;
        local_1b8[6] = false;
        local_1b8[7] = false;
        local_1b8[8] = true;
        local_1b8[9] = true;
        local_1b8[10] = false;
        local_1b8[0xb] = false;
        local_1b8[0xc] = false;
        local_1b8[0xd] = false;
        local_1b8[0xe] = false;
        local_1b8[0xf] = false;
        local_1b8[0x10] = false;
        local_1b8[0x11] = false;
        local_1b8[0x12] = false;
        local_1b8[0x13] = false;
        local_1b8[0x14] = false;
        local_1b8[0x15] = false;
        local_1b8[0x16] = false;
        local_1b8[0x17] = false;
        pcStack_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_198 = 0x65;
        LVar3.super_LineCol.col = 0;
        LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
        LVar3.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
        LVar3.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar3.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1f8,0x3a,LVar3,(this->m_stack).m_callbacks.m_user_data);
      }
      sVar17 = basic_substring<const_char>::first_not_of(&(this->m_state->line_contents).rem,' ',0);
      if (sVar17 == 0xffffffffffffffff) {
        sVar17 = (this->m_state->line_contents).rem.len;
      }
      goto LAB_0022010c;
    }
    if (local_208.len != 0) {
      if (*local_208.str == '#') goto LAB_0021f4df;
      if ((local_208.len != 0) && (*local_208.str == '}')) {
        if ((this->m_state->flags & 0x200) != 0) {
          pcVar21 = (this->m_buf).str;
          if ((local_208.str + -1 < pcVar21) || (pcVar21 + (this->m_buf).len < local_208.str + -1))
          {
            uStack_1c8 = 0x7562;
            uStack_1c6 = 0x66;
            uStack_1c5 = 0x292928646e652e;
            uStack_1be = 0;
            uStack_1d5 = 0x20262620;
            uStack_1d1 = 0x73;
            uStack_1d0 = 0x7274;
            uStack_1ce = 0x20;
            uStack_1cd = 0x5f6d203d3c;
            local_1e8 = 0x203d3e207274;
            uStack_1e2 = 0x6d;
            uStack_1e1 = 0x5f;
            uStack_1e0 = 0x65622e667562;
            uStack_1da = 0x67;
            uStack_1d9 = 0x29286e69;
            local_1f8.str = (char *)0x6166206b63656863;
            local_1f8.len._0_6_ = 0x203a64656c69;
            local_1f8.len._6_1_ = 0x28;
            local_1f8.len._7_1_ = 0x73;
            if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              uVar15 = (*pcVar1)();
              return (bool)uVar15;
            }
            local_1b8[0] = false;
            local_1b8[1] = false;
            local_1b8[2] = false;
            local_1b8[3] = false;
            local_1b8[4] = false;
            local_1b8[5] = false;
            local_1b8[6] = false;
            local_1b8[7] = false;
            local_1b8[8] = true;
            local_1b8[9] = true;
            local_1b8[10] = false;
            local_1b8[0xb] = false;
            local_1b8[0xc] = false;
            local_1b8[0xd] = false;
            local_1b8[0xe] = false;
            local_1b8[0xf] = false;
            local_1b8[0x10] = false;
            local_1b8[0x11] = false;
            local_1b8[0x12] = false;
            local_1b8[0x13] = false;
            local_1b8[0x14] = false;
            local_1b8[0x15] = false;
            local_1b8[0x16] = false;
            local_1b8[0x17] = false;
            pcStack_1a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_198 = 0x65;
            LVar4.super_LineCol.col = 0;
            LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
            LVar4.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
            LVar4.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar4.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1f8,0x3b,LVar4,(this->m_stack).m_callbacks.m_user_data);
          }
          _append_key_val(this,(csubstr)ZEXT816(0),0);
          this->m_state->flags = this->m_state->flags & 0xffffff7f;
        }
        _pop_level(this);
        _line_progressed(this,1);
        if ((this->m_state->flags & 0x2000) != 0) {
          _stop_seqimap(this);
          _pop_level(this);
          return true;
        }
        return true;
      }
    }
  }
  uVar19 = this->m_state->flags;
  if ((uVar19 >> 8 & 1) == 0) {
    if ((uVar19 & 0x40) == 0) {
      if (-1 < (char)uVar19) {
        bVar14 = is_debugger_attached();
        if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar1 = (code *)swi(3);
          uVar15 = (*pcVar1)();
          return (bool)uVar15;
        }
        pcVar21 = "ERROR: internal error";
        sVar17 = 0x15;
        goto LAB_0021f950;
      }
      if ((this->m_state->flags & 0x40) != 0) {
        local_1e8 = 0x6e6f6e5f7361;
        uStack_1e2 = 0x65;
        uStack_1e1 = 0x28;
        uStack_1e0 = 0x292959454b52;
        uStack_1da = 0;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_6_ = 0x203a64656c69;
        local_1f8.len._6_1_ = 0x28;
        local_1f8.len._7_1_ = 0x68;
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar1 = (code *)swi(3);
          uVar15 = (*pcVar1)();
          return (bool)uVar15;
        }
        local_168 = 0;
        uStack_160 = 0x6fe4;
        local_158 = 0;
        pcStack_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_148 = 0x65;
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6fe4) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x6fe4) << 0x40,8);
        LVar10.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar10.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1f8,0x1f,LVar10,(this->m_stack).m_callbacks.m_user_data);
      }
      if ((this->m_state->flags & 0x200) == 0) {
        local_1e8 = 0x6c6c615f7361;
        uStack_1e2 = 0x28;
        uStack_1e1 = 0x53;
        uStack_1e0 = 0x29294c4353;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_6_ = 0x203a64656c69;
        local_1f8.len._6_1_ = 0x28;
        local_1f8.len._7_1_ = 0x68;
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar1 = (code *)swi(3);
          uVar15 = (*pcVar1)();
          return (bool)uVar15;
        }
        local_190 = 0;
        uStack_188 = 0x6fe5;
        local_180 = 0;
        pcStack_178 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_170 = 0x65;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6fe5) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x6fe5) << 0x40,8);
        LVar11.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar11.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1f8,0x1e,LVar11,(this->m_stack).m_callbacks.m_user_data);
      }
      bVar14 = _scan_scalar_map_flow(this,&local_208,(bool *)&local_1f8);
      if (bVar14) {
        this->m_state->flags = this->m_state->flags & 0xfffffe3fU | 0x100;
        _append_key_val(this,local_208,(uint)(byte)local_1f8.str);
      }
      else {
        if (local_208.len != 0) {
          if (*local_208.str == '[') {
            this->m_state->flags = this->m_state->flags & 0xfffffe3fU | 0x100;
            _push_level(this,true);
            _move_scalar_from_top(this);
            _start_seq(this,true);
            this->m_state->flags = this->m_state->flags | 0x10;
            goto LAB_00220104;
          }
          if ((local_208.len != 0) && (*local_208.str == '{')) {
            this->m_state->flags = this->m_state->flags & 0xfffffe3fU | 0x100;
            _push_level(this,true);
            _move_scalar_from_top(this);
            _start_map(this,true);
            pSVar18 = this->m_state;
            uVar19 = pSVar18->flags & 0xfffffe2fU | 0x50;
            goto LAB_0021f92a;
          }
        }
        bVar14 = _handle_types(this);
        if (bVar14) {
          return true;
        }
        bVar14 = _handle_val_anchors_and_refs(this);
        if (bVar14) {
          return true;
        }
        if ((local_208.len == 0) || (*local_208.str != ',')) {
          uVar19 = this->m_state->flags;
          if (((uVar19 >> 0xd & 1) != 0 && local_208.len != 0) && (*local_208.str == ']')) {
            if ((uVar19 >> 9 & 1) != 0) {
              _append_key_val_null(this,local_208.str + -1);
            }
            goto LAB_0021fe43;
          }
          bVar14 = is_debugger_attached();
          if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar1 = (code *)swi(3);
            uVar15 = (*pcVar1)();
            return (bool)uVar15;
          }
          goto LAB_0021f944;
        }
        _append_key_val_null(this,local_208.str + -1);
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _line_progressed(this,1);
      }
      if ((this->m_state->flags & 0x2000) == 0) {
        return true;
      }
LAB_0021fe43:
      _stop_seqimap(this);
      _pop_level(this);
      return true;
    }
    if ((this->m_state->flags & 0x80) != 0) {
      local_1e8 = 0x6e6f6e5f7361;
      uStack_1e2 = 0x65;
      uStack_1e1 = 0x28;
      uStack_1e0 = 0x29294c415652;
      uStack_1da = 0;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_6_ = 0x203a64656c69;
      local_1f8.len._6_1_ = 0x28;
      local_1f8.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar1 = (code *)swi(3);
        uVar15 = (*pcVar1)();
        return (bool)uVar15;
      }
      local_f0 = 0;
      uStack_e8 = 0x6f6c;
      local_e0 = 0;
      pcStack_d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d0 = 0x65;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6f6c) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x6f6c) << 0x40,8);
      LVar8.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x1f,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    if (((this->m_state->flags & 0x200) == 0) &&
       (bVar14 = _scan_scalar_map_flow(this,&local_208,local_1b8), bVar14)) {
      _store_scalar(this,local_208,(uint)local_1b8[0]);
      local_208 = (this->m_state->line_contents).rem;
      chars.len = 2;
      chars.str = " \t";
      bVar24 = basic_substring<const_char>::triml(&local_208,chars);
      pcVar21 = bVar24.str;
      if (bVar24.len != 0) {
        if ((bVar24.len == 1) || (*pcVar21 != ':')) {
LAB_0021fabf:
          if (*pcVar21 != ':') {
            uVar23 = 0;
            do {
              uVar22 = uVar23;
              if (uVar22 == 2) break;
              uVar23 = uVar22 + 1;
            } while (*pcVar21 != ":,}"[uVar22 + 1]);
            if (1 < uVar22) goto LAB_0021fbe9;
          }
        }
        else {
          lVar13 = 0;
          do {
            lVar20 = lVar13;
            if (lVar20 == 1) break;
            lVar13 = lVar20 + 1;
          } while (pcVar21[lVar20 + 1] == "\": "[lVar20 + 2]);
          if (lVar20 == 0) goto LAB_0021fabf;
        }
        if (pcVar21 < local_208.str) {
          local_1e8 = 0x64656d6d6972;
          uStack_1e2 = 0x2e;
          uStack_1e1 = 0x73;
          uStack_1e0 = 0x203d3e207274;
          uStack_1da = 0x72;
          local_1f8.str = (char *)0x6166206b63656863;
          local_1f8.len._0_6_ = 0x203a64656c69;
          local_1f8.len._6_1_ = 0x28;
          local_1f8.len._7_1_ = 0x74;
          uStack_1d9 = 0x732e6d65;
          uStack_1d5 = 0x297274;
          if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar1 = (code *)swi(3);
            uVar15 = (*pcVar1)();
            return (bool)uVar15;
          }
          local_118 = 0;
          uStack_110 = 0x6f77;
          local_108 = 0;
          pcStack_100 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_f8 = 0x65;
          LVar9.super_LineCol.col = 0;
          LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6f77) << 0x40,0);
          LVar9.super_LineCol.line = SUB168(ZEXT816(0x6f77) << 0x40,8);
          LVar9.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar9.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_1f8,0x27,LVar9,(this->m_stack).m_callbacks.m_user_data);
        }
        uVar23 = (long)pcVar21 - (long)local_208.str;
        if (local_208.len < uVar23) {
          if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar1 = (code *)swi(3);
            uVar15 = (*pcVar1)();
            return (bool)uVar15;
          }
          handle_error(0x250c0a,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_1f8,local_208.str + uVar23,local_208.len - uVar23);
        local_208.len._6_1_ = local_1f8.len._6_1_;
        local_208.len._0_6_ = (undefined6)local_1f8.len;
        local_208.len._7_1_ = local_1f8.len._7_1_;
        local_208.str = local_1f8.str;
        _line_progressed(this,uVar23);
      }
    }
LAB_0021fbe9:
    sVar17 = local_208.len;
    if ((1 < local_208.len) && (*local_208.str == ':')) {
      lVar13 = 0;
      do {
        lVar20 = lVar13;
        if (lVar20 == 1) break;
        lVar13 = lVar20 + 1;
      } while (local_208.str[lVar20 + 1] == "\": "[lVar20 + 2]);
      if (lVar20 != 0) {
        this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
        sVar17 = 2;
        goto LAB_0021fe76;
      }
    }
    iVar16 = basic_substring<const_char>::compare(&local_208,':');
    if (iVar16 == 0) {
      this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
      sVar17 = 1;
      goto LAB_0021fe76;
    }
    if (sVar17 != 0) {
      if (*local_208.str == '?') {
        this->m_state->flags = this->m_state->flags | 0x20;
      }
      else {
        if (sVar17 == 0) goto LAB_00220126;
        if (*local_208.str == ',') {
          _append_key_val_null(this,local_208.str + -1);
        }
        else {
          if ((sVar17 == 0) || (*local_208.str != '}')) goto LAB_00220126;
          if ((this->m_state->flags & 0x200) == 0) {
            local_1e8 = 0x6c6c615f7361;
            uStack_1e2 = 0x28;
            uStack_1e1 = 0x53;
            uStack_1e0 = 0x29294c4353;
            local_1f8.str = (char *)0x6166206b63656863;
            local_1f8.len._0_6_ = 0x203a64656c69;
            local_1f8.len._6_1_ = 0x28;
            local_1f8.len._7_1_ = 0x68;
            if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              uVar15 = (*pcVar1)();
              return (bool)uVar15;
            }
            local_140 = 0;
            uStack_138 = 0x6fa8;
            local_130 = 0;
            pcStack_128 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_120 = 0x65;
            LVar12.super_LineCol.col = 0;
            LVar12.super_LineCol.offset = SUB168(ZEXT816(0x6fa8) << 0x40,0);
            LVar12.super_LineCol.line = SUB168(ZEXT816(0x6fa8) << 0x40,8);
            LVar12.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar12.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1f8,0x1e,LVar12,(this->m_stack).m_callbacks.m_user_data);
          }
          _append_key_val_null(this,local_208.str + -1);
          uVar19 = this->m_state->flags;
          this->m_state->flags = uVar19 & 0xffffff7f;
          if ((uVar19 >> 0xd & 1) != 0) {
            _stop_seqimap(this);
            _pop_level(this);
          }
          _pop_level(this);
        }
      }
LAB_00220104:
      sVar17 = 1;
LAB_0022010c:
      _line_progressed(this,sVar17);
      return true;
    }
LAB_00220126:
    bVar14 = _handle_types(this);
    if (bVar14) {
      return true;
    }
    bVar14 = _handle_key_anchors_and_refs(this);
    if (bVar14) {
      return true;
    }
    iVar16 = basic_substring<const_char>::compare(&local_208,"",0);
    if (iVar16 == 0) {
      return true;
    }
    chars_00.len = 2;
    chars_00.str = " \t";
    sVar17 = basic_substring<const_char>::first_not_of(&local_208,chars_00,0);
    if (sVar17 == 0xffffffffffffffff) {
      sVar17 = 0;
    }
    if (local_208.len < sVar17) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar1 = (code *)swi(3);
        uVar15 = (*pcVar1)();
        return (bool)uVar15;
      }
      handle_error(0x250c0a,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_1f8,local_208.str + sVar17,local_208.len - sVar17);
    local_208.len =
         CONCAT17(local_1f8.len._7_1_,CONCAT16(local_1f8.len._6_1_,(undefined6)local_1f8.len));
    local_208.str = local_1f8.str;
    if (local_208.len != 0) {
      if (*local_1f8.str == ':') {
        this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
        sVar17 = sVar17 + 1;
LAB_0021fe76:
        _line_progressed(this,sVar17);
        if ((this->m_state->flags & 0x200) == 0) {
          _store_scalar_null(this,local_208.str);
        }
        return true;
      }
      if ((local_208.len != 0) && (*local_1f8.str == '#')) {
        _line_progressed(this,sVar17);
LAB_0021f4df:
        _scan_comment(this);
        return true;
      }
    }
    bVar14 = is_debugger_attached();
    if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar1 = (code *)swi(3);
      uVar15 = (*pcVar1)();
      return (bool)uVar15;
    }
  }
  else {
    if ((uVar19 & 0x40) != 0) {
      local_1e8 = 0x6e6f6e5f7361;
      uStack_1e2 = 0x65;
      uStack_1e1 = 0x28;
      uStack_1e0 = 0x292959454b52;
      uStack_1da = 0;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_6_ = 0x203a64656c69;
      local_1f8.len._6_1_ = 0x28;
      local_1f8.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar1 = (code *)swi(3);
        uVar15 = (*pcVar1)();
        return (bool)uVar15;
      }
      local_78 = 0;
      uStack_70 = 0x6f52;
      local_68 = 0;
      pcStack_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_58 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6f52) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x6f52) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_state->flags & 0x80) != 0) {
      local_1e8 = 0x6e6f6e5f7361;
      uStack_1e2 = 0x65;
      uStack_1e1 = 0x28;
      uStack_1e0 = 0x29294c415652;
      uStack_1da = 0;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_6_ = 0x203a64656c69;
      local_1f8.len._6_1_ = 0x28;
      local_1f8.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar1 = (code *)swi(3);
        uVar15 = (*pcVar1)();
        return (bool)uVar15;
      }
      local_a0 = 0;
      uStack_98 = 0x6f53;
      local_90 = 0;
      pcStack_88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_80 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6f53) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6f53) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_state->flags & 0x2000) != 0) {
      local_1e8 = 0x6e6f6e5f7361;
      uStack_1e2 = 0x65;
      uStack_1e1 = 0x28;
      uStack_1e0 = 0x4d4951455352;
      uStack_1da = 0x41;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_6_ = 0x203a64656c69;
      local_1f8.len._6_1_ = 0x28;
      local_1f8.len._7_1_ = 0x68;
      uStack_1d9 = 0x292950;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar1 = (code *)swi(3);
        uVar15 = (*pcVar1)();
        return (bool)uVar15;
      }
      local_c8 = 0;
      uStack_c0 = 0x6f54;
      local_b8 = 0;
      pcStack_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_a8 = 0x65;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6f54) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x6f54) << 0x40,8);
      LVar7.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x23,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((1 < local_208.len) && (*local_208.str == ',')) {
      lVar13 = 0;
      do {
        lVar20 = lVar13;
        if (lVar20 == 1) break;
        lVar13 = lVar20 + 1;
      } while (local_208.str[lVar20 + 1] == ": must be in range [0, "[lVar20 + 0x16]);
      if (lVar20 != 0) {
        this->m_state->flags = this->m_state->flags & 0xfffffebfU | 0x40;
        sVar17 = 2;
        goto LAB_0022010c;
      }
    }
    if ((local_208.len != 0) && (*local_208.str == ',')) {
      pSVar18 = this->m_state;
      uVar19 = pSVar18->flags & 0xfffffebfU | 0x40;
LAB_0021f92a:
      pSVar18->flags = uVar19;
      goto LAB_00220104;
    }
    bVar14 = is_debugger_attached();
    if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar1 = (code *)swi(3);
      uVar15 = (*pcVar1)();
      return (bool)uVar15;
    }
  }
LAB_0021f944:
  pcVar21 = "ERROR: parse error";
  sVar17 = 0x12;
LAB_0021f950:
  fmt.len = sVar17;
  fmt.str = pcVar21;
  _err<>(this,fmt);
  return false;
}

Assistant:

bool Parser::_handle_map_flow()
{
    // explicit flow, ie, inside {}, separated by commas
    _c4dbgpf("handle_map_flow: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with('}'))
    {
        _c4dbgp("end the map");
        if(has_all(SSCL))
        {
            _c4dbgp("the last val was null");
            _append_key_val_null(rem.str - 1);
            rem_flags(RVAL);
        }
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _c4dbgp("stopping implicitly nested 1x map");
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RSEQIMAP));

        if(rem.begins_with(", "))
        {
            _c4dbgp("seq: expect next keyval");
            addrem_flags(RKEY, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("seq: expect next keyval");
            addrem_flags(RKEY, RNXT);
            _line_progressed(1);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        bool is_quoted;
        if(has_none(SSCL) && _scan_scalar_map_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            _store_scalar(rem, is_quoted);
            rem = m_state->line_contents.rem;
            csubstr trimmed = rem.triml(" \t");
            if(trimmed.len && (trimmed.begins_with(": ") || trimmed.begins_with_any(":,}") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, trimmed.str >= rem.str);
                size_t num = static_cast<size_t>(trimmed.str - rem.str);
                _c4dbgpf("trimming {} whitespace after the scalar: '{}' --> '{}'", num, rem, rem.sub(num));
                rem = rem.sub(num);
                _line_progressed(num);
            }
        }

        if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("wait for val");
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(2);
            if(!has_all(SSCL))
            {
                _c4dbgp("no key was found, defaulting to empty key ''");
                _store_scalar_null(rem.str);
            }
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgp("wait for val");
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            if(!has_all(SSCL))
            {
                _c4dbgp("no key was found, defaulting to empty key ''");
                _store_scalar_null(rem.str);
            }
            return true;
        }
        else if(rem.begins_with('?'))
        {
            _c4dbgp("complex key");
            add_flags(QMRK);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("prev scalar was a key with null value");
            _append_key_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('}'))
        {
            _c4dbgp("map terminates after a key...");
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
            _c4dbgp("the last val was null");
            _append_key_val_null(rem.str - 1);
            rem_flags(RVAL);
            if(has_all(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            _pop_level();
            _line_progressed(1);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem == "")
        {
            return true;
        }
        else
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == csubstr::npos)
               pos = 0;
            rem = rem.sub(pos);
            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(pos + 1);
                if(!has_all(SSCL))
                {
                    _c4dbgp("no key was found, defaulting to empty key ''");
                    _store_scalar_null(rem.str);
                }
                return true;
            }
            else if(rem.begins_with('#'))
            {
                _c4dbgp("it's a comment");
                _line_progressed(pos);
                rem = _scan_comment(); // also progresses the line
                return true;
            }
            else
            {
                _c4err("parse error");
            }
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
        bool is_quoted;
        if(_scan_scalar_map_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL|RKEY);
            _append_key_val(rem, is_quoted);
            if(has_all(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL|RKEY); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL|RKEY); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RNXT|RVAL);
            _line_progressed(1);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("appending empty val");
            _append_key_val_null(rem.str - 1);
            addrem_flags(RKEY, RVAL);
            _line_progressed(1);
            if(has_any(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            return true;
        }
        else if(has_any(RSEQIMAP) && rem.begins_with(']'))
        {
            _c4dbgp("stopping implicitly nested 1x map");
            if(has_any(SSCL))
            {
                _append_key_val_null(rem.str - 1);
            }
            _stop_seqimap();
            _pop_level();
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}